

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderCursor(Fts3Table *p,int iLangid,int iIndex,int iLevel,char *zTerm,int nTerm,
                       int isPrefix,int isScan,Fts3MultiSegReader *pCsr)

{
  int iVar1;
  void *pvVar2;
  int in_ECX;
  undefined4 in_EDX;
  int in_ESI;
  Fts3Table *in_RDI;
  Fts3Table *in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  sqlite3_int64 *pi;
  char *zRoot;
  int nRoot;
  sqlite3_int64 iEndBlock;
  int rc2;
  int rc;
  sqlite3_int64 iLeavesEndBlock;
  sqlite3_int64 iStartBlock;
  Fts3SegReader *pSeg_1;
  Fts3SegReader *pSeg;
  sqlite3_stmt *pStmt;
  sqlite3_int64 *in_stack_ffffffffffffff28;
  Fts3SegReader *in_stack_ffffffffffffff30;
  Fts3MultiSegReader *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  uint uVar3;
  sqlite3_int64 *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  uint uVar4;
  Fts3Table *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  Fts3Table *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  undefined3 uVar5;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar6;
  int local_58;
  sqlite3_int64 local_30;
  sqlite3_int64 local_28;
  int local_20;
  u8 uStack_1c;
  u8 uStack_1b;
  undefined2 uStack_1a;
  long local_18;
  sqlite3_int64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0;
  local_10 = 0;
  uVar6 = 0xaaaaaaaa;
  if (((in_ECX < 0) && (in_RDI->aIndex != (Fts3Index *)0x0)) && (in_RDI->iPrevLangid == in_ESI)) {
    local_18 = 0;
    uVar5 = (undefined3)in_stack_ffffffffffffff7c;
    in_stack_ffffffffffffff7c = CONCAT13(1,uVar5);
    if (in_stack_00000008 == 0) {
      in_stack_ffffffffffffff7c = CONCAT13(in_stack_00000010 != 0,uVar5);
    }
    in_stack_ffffffffffffff70 = in_R8;
    local_58 = sqlite3Fts3SegReaderPending
                         ((Fts3Table *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                          ,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),in_stack_ffffffffffffff80
                          ,in_stack_ffffffffffffff7c,in_R9D,(Fts3SegReader **)in_R8);
    in_stack_ffffffffffffff60 = in_RDI;
    in_stack_ffffffffffffff6c = in_EDX;
    in_stack_ffffffffffffff78 = in_R9D;
    if ((local_58 == 0) && (local_18 != 0)) {
      local_58 = fts3SegReaderCursorAppend(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff60 = in_RDI;
      in_stack_ffffffffffffff6c = in_EDX;
      in_stack_ffffffffffffff78 = in_R9D;
    }
  }
  if (in_ECX != -1) {
    if (local_58 == 0) {
      local_58 = sqlite3Fts3AllSegdirs
                           (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                            in_stack_ffffffffffffff58,
                            (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                            (sqlite3_stmt **)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    }
    do {
      uVar4 = in_stack_ffffffffffffff5c & 0xffffff;
      uVar3 = in_stack_ffffffffffffff4c;
      if (local_58 == 0) {
        local_58 = sqlite3_step((sqlite3_stmt *)
                                (CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58) &
                                0xffffffffffffff));
        uVar3 = in_stack_ffffffffffffff4c;
        uVar4 = CONCAT13(local_58 == 100,(int3)uVar4);
      }
      in_stack_ffffffffffffff5c = uVar4;
      if ((char)(in_stack_ffffffffffffff5c >> 0x18) == '\0') break;
      local_20 = 0;
      uStack_1c = '\0';
      uStack_1b = '\0';
      uStack_1a = 0;
      iVar1 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
      local_28 = sqlite3_column_int64((sqlite3_stmt *)in_stack_ffffffffffffff30,iVar1);
      local_30 = sqlite3_column_int64((sqlite3_stmt *)in_stack_ffffffffffffff30,iVar1);
      sqlite3_column_int64((sqlite3_stmt *)in_stack_ffffffffffffff30,iVar1);
      sqlite3_column_bytes((sqlite3_stmt *)in_stack_ffffffffffffff30,iVar1);
      pvVar2 = sqlite3_column_blob((sqlite3_stmt *)in_stack_ffffffffffffff30,iVar1);
      if (((local_28 != 0) && (in_R8 != (Fts3Table *)0x0)) && (pvVar2 != (void *)0x0)) {
        if (in_stack_00000008 == 0) {
          in_stack_ffffffffffffff28 = (sqlite3_int64 *)0x0;
        }
        else {
          in_stack_ffffffffffffff28 = &local_30;
        }
        in_stack_ffffffffffffff50 = in_stack_ffffffffffffff28;
        local_58 = fts3SelectLeaf(in_stack_ffffffffffffff70,
                                  (char *)CONCAT44(in_stack_ffffffffffffff6c,
                                                   in_stack_ffffffffffffff68),
                                  (int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                                  (char *)CONCAT44(in_stack_ffffffffffffff5c,
                                                   in_stack_ffffffffffffff58),
                                  (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                                  (sqlite3_int64 *)CONCAT44(uVar3,in_stack_ffffffffffffff48),
                                  (sqlite3_int64 *)CONCAT44(uVar6,in_stack_ffffffffffffffa0));
        if (local_58 != 0) break;
        if ((in_stack_00000008 == 0) && (in_stack_00000010 == 0)) {
          local_30 = local_28;
        }
      }
      in_stack_ffffffffffffff48 = *(int *)(in_stack_00000018 + 8) + 1;
      in_stack_ffffffffffffff4c = uVar3 & 0xffffff;
      if (in_stack_00000008 == 0) {
        in_stack_ffffffffffffff4c = CONCAT13(in_stack_00000010 == 0,(int3)uVar3);
      }
      in_stack_ffffffffffffff30 = (Fts3SegReader *)&stack0xffffffffffffffe0;
      in_stack_ffffffffffffff28 =
           (sqlite3_int64 *)((ulong)in_stack_ffffffffffffff28 & 0xffffffff00000000);
      local_58 = sqlite3Fts3SegReaderNew
                           ((int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                            (sqlite3_int64)in_stack_ffffffffffffff50,
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (char *)in_stack_ffffffffffffff38,(int)in_stack_ffffffffffffff70,
                            (Fts3SegReader **)
                            CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (local_58 != 0) break;
      local_58 = fts3SegReaderCursorAppend(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    } while( true );
  }
  iVar1 = sqlite3_reset((sqlite3_stmt *)
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (local_58 == 0x65) {
    local_58 = iVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_58;
}

Assistant:

static int fts3SegReaderCursor(
  Fts3Table *p,                   /* FTS3 table handle */
  int iLangid,                    /* Language id */
  int iIndex,                     /* Index to search (from 0 to p->nIndex-1) */
  int iLevel,                     /* Level of segments to scan */
  const char *zTerm,              /* Term to query for */
  int nTerm,                      /* Size of zTerm in bytes */
  int isPrefix,                   /* True for a prefix search */
  int isScan,                     /* True to scan from zTerm to EOF */
  Fts3MultiSegReader *pCsr        /* Cursor object to populate */
){
  int rc = SQLITE_OK;             /* Error code */
  sqlite3_stmt *pStmt = 0;        /* Statement to iterate through segments */
  int rc2;                        /* Result of sqlite3_reset() */

  /* If iLevel is less than 0 and this is not a scan, include a seg-reader
  ** for the pending-terms. If this is a scan, then this call must be being
  ** made by an fts4aux module, not an FTS table. In this case calling
  ** Fts3SegReaderPending might segfault, as the data structures used by
  ** fts4aux are not completely populated. So it's easiest to filter these
  ** calls out here.  */
  if( iLevel<0 && p->aIndex && p->iPrevLangid==iLangid ){
    Fts3SegReader *pSeg = 0;
    rc = sqlite3Fts3SegReaderPending(p, iIndex, zTerm, nTerm, isPrefix||isScan, &pSeg);
    if( rc==SQLITE_OK && pSeg ){
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3AllSegdirs(p, iLangid, iIndex, iLevel, &pStmt);
    }

    while( rc==SQLITE_OK && SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
      Fts3SegReader *pSeg = 0;

      /* Read the values returned by the SELECT into local variables. */
      sqlite3_int64 iStartBlock = sqlite3_column_int64(pStmt, 1);
      sqlite3_int64 iLeavesEndBlock = sqlite3_column_int64(pStmt, 2);
      sqlite3_int64 iEndBlock = sqlite3_column_int64(pStmt, 3);
      int nRoot = sqlite3_column_bytes(pStmt, 4);
      char const *zRoot = sqlite3_column_blob(pStmt, 4);

      /* If zTerm is not NULL, and this segment is not stored entirely on its
      ** root node, the range of leaves scanned can be reduced. Do this. */
      if( iStartBlock && zTerm && zRoot ){
        sqlite3_int64 *pi = (isPrefix ? &iLeavesEndBlock : 0);
        rc = fts3SelectLeaf(p, zTerm, nTerm, zRoot, nRoot, &iStartBlock, pi);
        if( rc!=SQLITE_OK ) goto finished;
        if( isPrefix==0 && isScan==0 ) iLeavesEndBlock = iStartBlock;
      }

      rc = sqlite3Fts3SegReaderNew(pCsr->nSegment+1,
          (isPrefix==0 && isScan==0),
          iStartBlock, iLeavesEndBlock,
          iEndBlock, zRoot, nRoot, &pSeg
      );
      if( rc!=SQLITE_OK ) goto finished;
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

 finished:
  rc2 = sqlite3_reset(pStmt);
  if( rc==SQLITE_DONE ) rc = rc2;

  return rc;
}